

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O3

void CreateBackwardReferencesNH54
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,HasherHandle hasher,int *dist_cache,
               size_t *last_insert_len,Command *commands,size_t *num_commands,size_t *num_literals)

{
  ulong uVar1;
  uint8_t *puVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  ushort uVar6;
  size_t sVar7;
  uint8_t uVar8;
  uint uVar9;
  ulong uVar10;
  uint8_t *puVar11;
  ulong uVar12;
  ulong uVar13;
  byte bVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  size_t sVar20;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  int iVar24;
  ushort uVar25;
  uint32_t uVar26;
  uint *puVar27;
  ulong uVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  uint32_t uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong local_100;
  ulong local_f0;
  Command *local_e8;
  ulong local_e0;
  ulong local_c8;
  size_t local_b8;
  uint local_68;
  
  uVar4 = (position - 7) + num_bytes;
  sVar20 = position;
  if (7 < num_bytes) {
    sVar20 = uVar4;
  }
  lVar21 = 0x200;
  if (params->quality < 9) {
    lVar21 = 0x40;
  }
  local_b8 = *last_insert_len;
  uVar1 = position + num_bytes;
  if (uVar1 <= position + 8) {
    local_e8 = commands;
LAB_0010b065:
    *last_insert_len = (local_b8 + uVar1) - position;
    *num_commands = *num_commands + ((long)local_e8 - (long)commands >> 4);
    return;
  }
  uVar36 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  uVar12 = lVar21 + position;
  lVar3 = position - 1;
  local_e8 = commands;
  uVar13 = position;
LAB_0010a5a4:
  local_f0 = uVar1 - uVar13;
  uVar22 = uVar36;
  if (uVar13 < uVar36) {
    uVar22 = uVar13;
  }
  uVar10 = uVar13 & ringbuffer_mask;
  puVar2 = ringbuffer + uVar10;
  local_e0 = (ulong)*dist_cache;
  local_c8 = 0x7e4;
  local_68 = (uint)ringbuffer_mask;
  uVar8 = (uint8_t)*(long *)(ringbuffer + uVar10);
  if ((uVar13 - local_e0 < uVar13) &&
     (uVar17 = (ulong)((uint)(uVar13 - local_e0) & local_68), ringbuffer[uVar17] == uVar8)) {
    if (7 < local_f0) {
      uVar15 = local_f0 & 0xfffffffffffffff8;
      puVar11 = ringbuffer + uVar15 + uVar10;
      lVar16 = 0;
      uVar33 = 0;
LAB_0010a63f:
      if (*(ulong *)(puVar2 + uVar33 * 8) == *(ulong *)(ringbuffer + uVar33 * 8 + uVar17))
      goto code_r0x0010a650;
      uVar33 = *(ulong *)(ringbuffer + uVar33 * 8 + uVar17) ^ *(ulong *)(puVar2 + uVar33 * 8);
      uVar17 = 0;
      if (uVar33 != 0) {
        for (; (uVar33 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
        }
      }
      uVar33 = (uVar17 >> 3 & 0x1fffffff) - lVar16;
      goto LAB_0010abd1;
    }
    uVar15 = 0;
    puVar11 = puVar2;
LAB_0010b01f:
    uVar18 = local_f0 & 7;
    uVar33 = uVar15;
    if (uVar18 != 0) {
      uVar28 = uVar15 | uVar18;
      do {
        uVar33 = uVar15;
        if (ringbuffer[uVar15 + uVar17] != *puVar11) break;
        puVar11 = puVar11 + 1;
        uVar15 = uVar15 + 1;
        uVar18 = uVar18 - 1;
        uVar33 = uVar28;
      } while (uVar18 != 0);
    }
LAB_0010abd1:
    if ((uVar33 < 4) || (uVar17 = uVar33 * 0x87 + 0x78f, uVar17 < 0x7e5)) {
      local_e0 = 0;
      uVar33 = 0;
    }
    else {
      uVar8 = puVar2[uVar33];
      local_c8 = uVar17;
    }
  }
  else {
    local_e0 = 0;
    uVar33 = 0;
  }
  uVar15 = *(long *)(ringbuffer + uVar10) * 0x35a7bd1e35a7bd00;
  puVar27 = (uint *)(hasher + (uVar15 >> 0x2c) * 4 + 0x28);
  uVar17 = (ulong)((uint)local_f0 & 7);
  iVar29 = 0;
  do {
    uVar23 = *puVar27;
    uVar9 = local_68 & uVar23;
    if (((uVar8 == ringbuffer[uVar33 + uVar9]) && (uVar13 != uVar23)) &&
       (uVar18 = uVar13 - uVar23, uVar18 <= uVar22)) {
      if (7 < local_f0) {
        lVar16 = 0;
        uVar28 = 0;
LAB_0010a707:
        if (*(ulong *)(puVar2 + uVar28 * 8) == *(ulong *)(ringbuffer + uVar28 * 8 + (ulong)uVar9))
        goto code_r0x0010a714;
        uVar37 = *(ulong *)(ringbuffer + uVar28 * 8 + (ulong)uVar9) ^
                 *(ulong *)(puVar2 + uVar28 * 8);
        uVar28 = 0;
        if (uVar37 != 0) {
          for (; (uVar37 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
          }
        }
        uVar28 = (uVar28 >> 3 & 0x1fffffff) - lVar16;
        goto LAB_0010a751;
      }
      puVar11 = puVar2;
      uVar37 = 0;
LAB_0010a79f:
      uVar28 = uVar37;
      if (uVar17 != 0) {
        uVar34 = uVar17 | uVar37;
        uVar35 = uVar17;
        do {
          uVar28 = uVar37;
          if (ringbuffer[uVar37 + uVar9] != *puVar11) break;
          puVar11 = puVar11 + 1;
          uVar37 = uVar37 + 1;
          uVar35 = uVar35 - 1;
          uVar28 = uVar34;
        } while (uVar35 != 0);
      }
LAB_0010a751:
      if (3 < uVar28) {
        iVar24 = 0x1f;
        if ((uint)uVar18 != 0) {
          for (; (uint)uVar18 >> iVar24 == 0; iVar24 = iVar24 + -1) {
          }
        }
        uVar37 = (ulong)(iVar24 * -0x1e + 0x780) + uVar28 * 0x87;
        if (local_c8 < uVar37) {
          uVar8 = puVar2[uVar28];
          uVar33 = uVar28;
          local_e0 = uVar18;
          local_c8 = uVar37;
        }
      }
    }
    puVar27 = puVar27 + 1;
    iVar29 = iVar29 + 1;
  } while (iVar29 != 4);
  *(int *)(hasher + (ulong)((uint)(uVar15 >> 0x2c) + ((uint)(uVar13 >> 3) & 3)) * 4 + 0x28) =
       (int)uVar13;
  if (0x7e4 < local_c8) {
    iVar29 = *dist_cache;
    uVar12 = local_b8 + 4;
    uVar22 = (lVar3 + num_bytes) - uVar13;
    iVar24 = 0;
LAB_0010a836:
    local_f0 = local_f0 - 1;
    uVar10 = uVar33 - 1;
    if (local_f0 <= uVar33 - 1) {
      uVar10 = local_f0;
    }
    if (4 < params->quality) {
      uVar10 = 0;
    }
    uVar17 = uVar13 + 1;
    uVar15 = uVar36;
    if (uVar17 < uVar36) {
      uVar15 = uVar17;
    }
    puVar2 = ringbuffer + (uVar17 & ringbuffer_mask);
    uVar8 = puVar2[uVar10];
    uVar28 = uVar17 - (long)iVar29;
    uVar18 = 0x7e4;
    if ((uVar28 < uVar17) &&
       (uVar23 = (uint)uVar28 & local_68, uVar8 == ringbuffer[uVar10 + uVar23])) {
      if (7 < local_f0) {
        lVar16 = 0;
        uVar28 = 0;
LAB_0010a8cd:
        if (*(ulong *)(puVar2 + uVar28 * 8) == *(ulong *)(ringbuffer + uVar28 * 8 + (ulong)uVar23))
        goto code_r0x0010a8da;
        uVar37 = *(ulong *)(ringbuffer + uVar28 * 8 + (ulong)uVar23) ^
                 *(ulong *)(puVar2 + uVar28 * 8);
        uVar28 = 0;
        if (uVar37 != 0) {
          for (; (uVar37 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
          }
        }
        uVar28 = (uVar28 >> 3 & 0x1fffffff) - lVar16;
        goto LAB_0010a910;
      }
      uVar28 = 0;
      puVar11 = puVar2;
      goto LAB_0010aaf5;
    }
    goto LAB_0010a943;
  }
  local_b8 = local_b8 + 1;
  position = uVar13 + 1;
  if (uVar12 < position) {
    if ((uint)((int)lVar21 * 4) + uVar12 < position) {
      uVar22 = uVar13 + 0x11;
      if (uVar4 <= uVar13 + 0x11) {
        uVar22 = uVar4;
      }
      for (; position < uVar22; position = position + 4) {
        *(int *)(hasher + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)
                                                          ) * 0x35a7bd1e35a7bd00) >> 0x2c) +
                                 ((uint)(position >> 3) & 3)) * 4 + 0x28) = (int)position;
        local_b8 = local_b8 + 4;
      }
    }
    else {
      uVar22 = uVar13 + 9;
      if (uVar4 <= uVar13 + 9) {
        uVar22 = uVar4;
      }
      for (; position < uVar22; position = position + 2) {
        *(int *)(hasher + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)
                                                          ) * 0x35a7bd1e35a7bd00) >> 0x2c) +
                                 ((uint)(position >> 3) & 3)) * 4 + 0x28) = (int)position;
        local_b8 = local_b8 + 2;
      }
    }
  }
  goto LAB_0010afb1;
code_r0x0010a650:
  uVar33 = uVar33 + 1;
  lVar16 = lVar16 + -8;
  if (local_f0 >> 3 == uVar33) goto LAB_0010b01f;
  goto LAB_0010a63f;
code_r0x0010a714:
  uVar28 = uVar28 + 1;
  lVar16 = lVar16 + -8;
  puVar11 = ringbuffer + (local_f0 & 0xfffffffffffffff8) + uVar10;
  uVar37 = local_f0 & 0xfffffffffffffff8;
  if (local_f0 >> 3 == uVar28) goto LAB_0010a79f;
  goto LAB_0010a707;
code_r0x0010a8da:
  uVar28 = uVar28 + 1;
  lVar16 = lVar16 + -8;
  if (uVar22 >> 3 == uVar28) goto code_r0x0010a8e8;
  goto LAB_0010a8cd;
code_r0x0010a8e8:
  uVar28 = -lVar16;
  puVar11 = puVar2 + -lVar16;
LAB_0010aaf5:
  uVar37 = local_f0 & 7;
  for (; (uVar37 != 0 && (ringbuffer[uVar28 + uVar23] == *puVar11)); uVar28 = uVar28 + 1) {
    puVar11 = puVar11 + 1;
    uVar37 = uVar37 - 1;
  }
LAB_0010a910:
  if ((uVar28 < 4) || (uVar37 = uVar28 * 0x87 + 0x78f, uVar37 < 0x7e5)) {
LAB_0010a943:
    local_100 = 0;
  }
  else {
    uVar8 = puVar2[uVar28];
    uVar10 = uVar28;
    uVar18 = uVar37;
    local_100 = (long)iVar29;
  }
  puVar27 = (uint *)(hasher + ((ulong)(*(long *)(ringbuffer + (uVar17 & ringbuffer_mask)) *
                                      0x35a7bd1e35a7bd00) >> 0x2c) * 4 + 0x28);
  uVar28 = (ulong)((uint)local_f0 & 7);
  iVar30 = 0;
LAB_0010a983:
  uVar23 = *puVar27;
  uVar9 = local_68 & uVar23;
  if (((uVar8 == ringbuffer[uVar10 + uVar9]) && (uVar17 != uVar23)) &&
     (uVar37 = uVar17 - uVar23, uVar37 <= uVar15)) {
    uVar35 = uVar28;
    if (7 < local_f0) {
      lVar16 = 0;
      uVar34 = 0;
LAB_0010a9c6:
      if (*(ulong *)(puVar2 + uVar34 * 8) == *(ulong *)(ringbuffer + uVar34 * 8 + (ulong)uVar9))
      goto code_r0x0010a9d3;
      uVar34 = *(ulong *)(ringbuffer + uVar34 * 8 + (ulong)uVar9) ^ *(ulong *)(puVar2 + uVar34 * 8);
      uVar35 = 0;
      if (uVar34 != 0) {
        for (; (uVar34 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
        }
      }
      uVar34 = (uVar35 >> 3 & 0x1fffffff) - lVar16;
      goto LAB_0010a9fc;
    }
    uVar34 = 0;
    puVar11 = puVar2;
    goto joined_r0x0010aa53;
  }
  goto LAB_0010aa38;
code_r0x0010a9d3:
  uVar34 = uVar34 + 1;
  lVar16 = lVar16 + -8;
  if (uVar22 >> 3 == uVar34) goto code_r0x0010a9e1;
  goto LAB_0010a9c6;
code_r0x0010a9e1:
  uVar34 = -lVar16;
  puVar11 = puVar2 + -lVar16;
joined_r0x0010aa53:
  for (; (uVar35 != 0 && (ringbuffer[uVar34 + uVar9] == *puVar11)); uVar34 = uVar34 + 1) {
    puVar11 = puVar11 + 1;
    uVar35 = uVar35 - 1;
  }
LAB_0010a9fc:
  if (3 < uVar34) {
    iVar5 = 0x1f;
    if ((uint)uVar37 != 0) {
      for (; (uint)uVar37 >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    uVar35 = (ulong)(iVar5 * -0x1e + 0x780) + uVar34 * 0x87;
    if (uVar18 < uVar35) {
      uVar8 = puVar2[uVar34];
      uVar10 = uVar34;
      uVar18 = uVar35;
      local_100 = uVar37;
    }
  }
LAB_0010aa38:
  puVar27 = puVar27 + 1;
  iVar30 = iVar30 + 1;
  if (iVar30 == 4) goto LAB_0010aa6d;
  goto LAB_0010a983;
LAB_0010aa6d:
  *(int *)(hasher + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (uVar17 & ringbuffer_mask)) *
                                          0x35a7bd1e35a7bd00) >> 0x2c) + ((uint)(uVar17 >> 3) & 3))
                    * 4 + 0x28) = (int)uVar17;
  if (uVar18 < local_c8 + 0xaf) {
    uVar17 = uVar13;
    uVar10 = uVar33;
    uVar15 = uVar36;
    sVar7 = local_b8;
    if (uVar13 < uVar36) {
      uVar15 = uVar13;
    }
    goto LAB_0010ac53;
  }
  local_e0 = local_100;
  sVar7 = uVar12;
  if (iVar24 == 3) goto LAB_0010ac53;
  local_b8 = local_b8 + 1;
  iVar24 = iVar24 + 1;
  uVar28 = uVar13 + 9;
  uVar22 = uVar22 - 1;
  uVar13 = uVar17;
  uVar33 = uVar10;
  local_c8 = uVar18;
  sVar7 = local_b8;
  if (uVar1 <= uVar28) goto LAB_0010ac53;
  goto LAB_0010a836;
LAB_0010ac53:
  local_b8 = sVar7;
  uVar23 = (uint)local_b8;
  uVar32 = (uint32_t)uVar10;
  if (uVar15 < local_e0) {
LAB_0010ac74:
    uVar12 = local_e0 + 0xf;
  }
  else {
    if (local_e0 == (long)*dist_cache) {
      local_e8->insert_len_ = uVar23;
      local_e8->copy_len_ = uVar32;
      uVar9 = 0;
      uVar26 = 0;
      goto LAB_0010ad4f;
    }
    uVar12 = 1;
    if (local_e0 != (long)dist_cache[1]) {
      uVar12 = (local_e0 + 3) - (long)*dist_cache;
      if (uVar12 < 7) {
        bVar14 = (byte)((int)uVar12 << 2);
        uVar9 = 0x9750468;
      }
      else {
        uVar12 = (local_e0 + 3) - (long)dist_cache[1];
        if (6 < uVar12) {
          uVar12 = 2;
          if ((local_e0 != (long)dist_cache[2]) && (uVar12 = 3, local_e0 != (long)dist_cache[3]))
          goto LAB_0010ac74;
          goto LAB_0010ac78;
        }
        bVar14 = (byte)((int)uVar12 << 2);
        uVar9 = 0xfdb1ace;
      }
      uVar12 = (ulong)(uVar9 >> (bVar14 & 0x1f) & 0xf);
    }
  }
LAB_0010ac78:
  if ((local_e0 <= uVar15) && (uVar12 != 0)) {
    dist_cache[3] = dist_cache[2];
    *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
    *dist_cache = (int)local_e0;
  }
  local_e8->insert_len_ = uVar23;
  local_e8->copy_len_ = uVar32;
  uVar22 = (ulong)(params->dist).num_direct_distance_codes;
  uVar13 = uVar22 + 0x10;
  uVar26 = 0;
  if (uVar13 <= uVar12) {
    uVar9 = (params->dist).distance_postfix_bits;
    bVar14 = (byte)uVar9;
    uVar22 = ((4L << (bVar14 & 0x3f)) + (uVar12 - uVar22)) - 0x10;
    uVar31 = 0x1f;
    uVar19 = (uint)uVar22;
    if (uVar19 != 0) {
      for (; uVar19 >> uVar31 == 0; uVar31 = uVar31 - 1) {
      }
    }
    uVar31 = (uVar31 ^ 0xffffffe0) + 0x1f;
    uVar33 = (ulong)((uVar22 >> ((ulong)uVar31 & 0x3f) & 1) != 0);
    lVar16 = (ulong)uVar31 - (ulong)uVar9;
    uVar12 = (~(-1 << (bVar14 & 0x1f)) & uVar19) + uVar13 +
             (uVar33 + lVar16 * 2 + 0xfffe << (bVar14 & 0x3f)) | lVar16 * 0x400;
    uVar26 = (uint32_t)(uVar22 - (uVar33 + 2 << ((byte)uVar31 & 0x3f)) >> (bVar14 & 0x3f));
  }
  uVar9 = (uint)uVar12;
LAB_0010ad4f:
  local_e8->dist_prefix_ = (uint16_t)uVar9;
  local_e8->dist_extra_ = uVar26;
  if (5 < local_b8) {
    if (local_b8 < 0x82) {
      uVar23 = 0x1f;
      uVar31 = (uint)(local_b8 - 2);
      if (uVar31 != 0) {
        for (; uVar31 >> uVar23 == 0; uVar23 = uVar23 - 1) {
        }
      }
      uVar23 = (int)(local_b8 - 2 >> ((char)(uVar23 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar23 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_b8 < 0x842) {
      uVar31 = 0x1f;
      if (uVar23 - 0x42 != 0) {
        for (; uVar23 - 0x42 >> uVar31 == 0; uVar31 = uVar31 - 1) {
        }
      }
      uVar23 = (uVar31 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar23 = 0x15;
      if (0x1841 < local_b8) {
        uVar23 = (uint)(ushort)(0x17 - (local_b8 < 0x5842));
      }
    }
  }
  uVar12 = (ulong)(int)uVar32;
  if (uVar12 < 10) {
    uVar31 = uVar32 - 2;
  }
  else if (uVar12 < 0x86) {
    uVar31 = 0x1f;
    uVar19 = (uint)(uVar12 - 6);
    if (uVar19 != 0) {
      for (; uVar19 >> uVar31 == 0; uVar31 = uVar31 - 1) {
      }
    }
    uVar31 = (int)(uVar12 - 6 >> ((char)(uVar31 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
             (uVar31 ^ 0xffffffe0) * 2 + 0x42;
  }
  else {
    uVar31 = 0x17;
    if (uVar12 < 0x846) {
      uVar31 = 0x1f;
      if (uVar32 - 0x46 != 0) {
        for (; uVar32 - 0x46 >> uVar31 == 0; uVar31 = uVar31 - 1) {
        }
      }
      uVar31 = (uVar31 ^ 0xffe0) + 0x2c;
    }
  }
  uVar6 = (ushort)uVar31;
  uVar25 = (uVar6 & 7) + ((ushort)uVar23 & 7) * 8;
  if ((((uVar9 & 0x3ff) == 0) && ((ushort)uVar23 < 8)) && (uVar6 < 0x10)) {
    if (7 < uVar6) {
      uVar25 = uVar25 | 0x40;
    }
  }
  else {
    iVar29 = ((uVar23 & 0xffff) >> 3) * 3 + ((uVar31 & 0xffff) >> 3);
    uVar25 = uVar25 + ((ushort)(0x520d40 >> ((char)iVar29 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar29 * 0x40 + 0x40;
  }
  local_e8->cmd_prefix_ = uVar25;
  *num_literals = *num_literals + local_b8;
  position = uVar10 + uVar17;
  uVar13 = sVar20;
  if (position < sVar20) {
    uVar13 = position;
  }
  uVar22 = uVar17 + 2;
  if (local_e0 < uVar10 >> 2) {
    uVar12 = position + local_e0 * -4;
    if (uVar12 < uVar22) {
      uVar12 = uVar22;
    }
    uVar22 = uVar12;
    if (uVar13 < uVar12) {
      uVar22 = uVar13;
    }
  }
  uVar12 = uVar17 + lVar21 + uVar10 * 2;
  local_e8 = local_e8 + 1;
  if (uVar22 < uVar13) {
    do {
      *(int *)(hasher + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (uVar22 & ringbuffer_mask)) *
                                              0x35a7bd1e35a7bd00) >> 0x2c) +
                               ((uint)(uVar22 >> 3) & 3)) * 4 + 0x28) = (int)uVar22;
      uVar22 = uVar22 + 1;
    } while (uVar13 != uVar22);
    local_b8 = 0;
  }
  else {
    local_b8 = 0;
  }
LAB_0010afb1:
  uVar13 = position;
  if (uVar1 <= position + 8) goto LAB_0010b065;
  goto LAB_0010a5a4;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, HasherHandle hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(hasher, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(hasher, &params->dictionary,
                         ringbuffer, ringbuffer_mask, dist_cache, position,
                         max_length, max_distance, gap,
                         params->dist.max_distance, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        FN(FindLongestMatch)(hasher, &params->dictionary,
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, gap, params->dist.max_distance, &sr2);
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance + gap, dist_cache);
        if ((sr.distance <= (max_distance + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(hasher, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}